

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Cpu.h
# Opt level: O3

void __thiscall Hes_Emu::irq_changed(Hes_Emu *this)

{
  byte bVar1;
  state_t *psVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  psVar2 = (this->super_Hes_Cpu).state;
  iVar3 = psVar2->base + psVar2->time;
  iVar4 = (this->irq).timer;
  if (iVar3 < iVar4) {
    (this->irq).timer = 0x40000000;
    iVar4 = 0x40000000;
    if (((this->timer).enabled != '\0') && ((this->timer).fired == '\0')) {
      iVar4 = (this->timer).count + iVar3;
      (this->irq).timer = iVar4;
    }
  }
  iVar5 = (this->irq).vdp;
  if (iVar3 < iVar5) {
    (this->irq).vdp = 0x40000000;
    iVar5 = 0x40000000;
    if (((this->vdp).control & 8) != 0) {
      iVar5 = (this->vdp).next_vbl;
      (this->irq).vdp = iVar5;
    }
  }
  bVar1 = (this->irq).disables;
  iVar6 = 0x40000000;
  if ((bVar1 & 4) == 0) {
    iVar6 = iVar4;
  }
  if (iVar6 < iVar5) {
    iVar5 = iVar6;
  }
  if ((bVar1 & 2) != 0) {
    iVar5 = iVar6;
  }
  iVar4 = (this->super_Hes_Cpu).end_time_;
  (this->super_Hes_Cpu).irq_time_ = iVar5;
  iVar6 = iVar4;
  if (((this->super_Hes_Cpu).r.status & 4) == 0) {
    iVar6 = iVar5;
  }
  if (iVar4 <= iVar5) {
    iVar6 = iVar4;
  }
  psVar2->base = iVar6;
  psVar2->time = iVar3 - iVar6;
  return;
}

Assistant:

hes_time_t time() const             { return state->time + state->base; }